

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxquality.hpp
# Opt level: O3

void __thiscall
soplex::SPxSolverBase<double>::qualSlackViolation
          (SPxSolverBase<double> *this,double *maxviol,double *sumviol)

{
  int iVar1;
  Item *pIVar2;
  DataKey *pDVar3;
  Nonzero<double> *pNVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  VectorBase<double> solu;
  VectorBase<double> slacks;
  VectorBase<double> local_48;
  VectorBase<double> local_30;
  
  *maxviol = 0.0;
  *sumviol = 0.0;
  VectorBase<double>::VectorBase
            (&local_48,
             (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.set.
             thenum);
  VectorBase<double>::VectorBase
            (&local_30,
             (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             thenum);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x60])(this,&local_48);
  (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
    super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x61])(this,&local_30);
  lVar5 = (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
                set.thenum;
  if (lVar5 < 1) {
    if (local_30.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_001e2470;
  }
  else {
    pIVar2 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             theitem;
    pDVar3 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set.
             thekey;
    lVar6 = 0;
    do {
      iVar1 = pDVar3[lVar6].idx;
      lVar7 = (long)pIVar2[iVar1].data.super_SVectorBase<double>.memused;
      if (lVar7 < 1) {
        dVar9 = 0.0;
      }
      else {
        pNVar4 = pIVar2[iVar1].data.super_SVectorBase<double>.m_elem;
        dVar9 = 0.0;
        lVar8 = 0;
        do {
          dVar9 = dVar9 + *(double *)((long)&pNVar4->val + lVar8) *
                          local_48.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[*(int *)((long)&pNVar4->idx + lVar8)];
          lVar8 = lVar8 + 0x10;
        } while (lVar7 * 0x10 != lVar8);
      }
      dVar9 = ABS(dVar9 - local_30.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar6]);
      if (*maxviol <= dVar9 && dVar9 != *maxviol) {
        *maxviol = dVar9;
      }
      *sumviol = *sumviol + dVar9;
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5);
  }
  operator_delete(local_30.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_30.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage -
                  (long)local_30.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
LAB_001e2470:
  if (local_48.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::qualSlackViolation(R& maxviol, R& sumviol) const
{
   maxviol = 0.0;
   sumviol = 0.0;

   VectorBase<R> solu(this->nCols());
   VectorBase<R> slacks(this->nRows());

   getPrimalSol(solu);
   getSlacks(slacks);

   for(int row = 0; row < this->nRows(); ++row)
   {
      const SVectorBase<R>& rowvec = this->rowVector(row);

      R val = 0.0;

      for(int col = 0; col < rowvec.size(); ++col)
         val += rowvec.value(col) * solu[rowvec.index(col)];

      R viol = spxAbs(val - slacks[row]);

      if(viol > maxviol)
         maxviol = viol;

      sumviol += viol;
   }
}